

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_file_contents(archive_write *a,int64_t offset,int64_t size)

{
  void *pvVar1;
  int iVar2;
  archive_write *a_00;
  ssize_t sVar3;
  uint *puVar4;
  ulong in_RDX;
  __off_t in_RSI;
  archive_write *in_RDI;
  uchar *wb;
  ssize_t rs;
  size_t rsize;
  int r;
  iso9660_conflict *iso9660;
  size_t in_stack_ffffffffffffffb0;
  size_t local_38;
  ulong local_20;
  
  pvVar1 = in_RDI->format_data;
  lseek(*(int *)((long)pvVar1 + 8),in_RSI,0);
  local_20 = in_RDX;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    a_00 = (archive_write *)wb_buffptr(in_RDI);
    local_38 = *(ulong *)((long)in_RDI->format_data + 0x102e0);
    if (local_20 < local_38) {
      local_38 = local_20;
    }
    sVar3 = read(*(int *)((long)pvVar1 + 8),a_00,local_38);
    if (sVar3 < 1) break;
    local_20 = local_20 - sVar3;
    iVar2 = wb_consume(a_00,in_stack_ffffffffffffffb0);
    if (iVar2 < 0) {
      return iVar2;
    }
  }
  puVar4 = (uint *)__errno_location();
  archive_set_error(&in_RDI->archive,(int)(ulong)*puVar4,"Can\'t read temporary file(%jd)",sVar3);
  return -0x1e;
}

Assistant:

static int
write_file_contents(struct archive_write *a, int64_t offset, int64_t size)
{
	struct iso9660 *iso9660 = a->format_data;
	int r;

	lseek(iso9660->temp_fd, offset, SEEK_SET);

	while (size) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		wb = wb_buffptr(a);
		rsize = wb_remaining(a);
		if (rsize > (size_t)size)
			rsize = (size_t)size;
		rs = read(iso9660->temp_fd, wb, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)", (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		size -= rs;
		r = wb_consume(a, rs);
		if (r < 0)
			return (r);
	}
	return (ARCHIVE_OK);
}